

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_lookup_and_goto_ptr_ppc64(TCGContext_conflict10 *tcg_ctx)

{
  TCGv_ptr retval;
  TCGArg a1;
  TCGv_ptr ptr;
  TCGContext_conflict10 *tcg_ctx_local;
  
  retval = tcg_temp_new_ptr(tcg_ctx);
  gen_helper_lookup_tb_ptr(tcg_ctx,retval,tcg_ctx->cpu_env);
  a1 = tcgv_ptr_arg(tcg_ctx,retval);
  tcg_gen_op1i(tcg_ctx,INDEX_op_goto_ptr,a1);
  tcg_temp_free_ptr(tcg_ctx,retval);
  return;
}

Assistant:

void tcg_gen_lookup_and_goto_ptr(TCGContext *tcg_ctx)
{
#if TCG_TARGET_HAS_goto_ptr
        TCGv_ptr ptr;

        ptr = tcg_temp_new_ptr(tcg_ctx);
        gen_helper_lookup_tb_ptr(tcg_ctx, ptr, tcg_ctx->cpu_env);
        tcg_gen_op1i(tcg_ctx, INDEX_op_goto_ptr, tcgv_ptr_arg(tcg_ctx, ptr));
        tcg_temp_free_ptr(tcg_ctx, ptr);
#else
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
#endif
}